

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double regularizer_direction_magnitude<sparse_parameters>
                 (vw *param_1,bfgs *b,double regularizer,sparse_parameters *weights)

{
  float fVar1;
  float fVar2;
  double dVar3;
  bool bVar4;
  uint32_t uVar5;
  float *pfVar6;
  int __c;
  sparse_parameters *in_RDX;
  long in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  double in_XMM0_Qa;
  iterator iVar7;
  iterator iter_1;
  iterator iter;
  double ret;
  sparse_iterator<float> *in_stack_ffffffffffffff28;
  sparse_parameters *in_stack_ffffffffffffff30;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_98;
  uint32_t local_90;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_88;
  uint32_t local_80;
  sparse_iterator<float> local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_68;
  uint32_t local_60;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_58;
  uint32_t local_50;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_48;
  uint32_t local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_38;
  uint32_t local_30;
  double local_28;
  sparse_parameters *local_20;
  double local_18;
  long local_10;
  
  local_28 = 0.0;
  if (*(long *)(in_RSI + 0xd8) == 0) {
    local_18 = in_XMM0_Qa;
    iVar7 = sparse_parameters::begin(in_stack_ffffffffffffff30);
    local_48._M_cur =
         (__node_type *)
         iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_40 = iVar7._stride;
    local_38._M_cur = local_48._M_cur;
    local_30 = local_40;
    while( true ) {
      iVar7 = sparse_parameters::end(in_stack_ffffffffffffff30);
      local_68._M_cur =
           (__node_type *)
           iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_60 = iVar7._stride;
      local_58._M_cur = local_68._M_cur;
      local_50 = local_60;
      bVar4 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff28);
      dVar3 = local_18;
      if (!bVar4) break;
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x279fd9);
      fVar1 = pfVar6[2];
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x279fff);
      local_28 = dVar3 * (double)fVar1 * (double)pfVar6[2] + local_28;
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_ffffffffffffff30);
    }
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RSI;
    iVar7 = sparse_parameters::begin(in_stack_ffffffffffffff30);
    local_88._M_cur =
         (__node_type *)
         iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_80 = iVar7._stride;
    local_78._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_88._M_cur;
    local_78._stride = local_80;
    while( true ) {
      iVar7 = sparse_parameters::end(in_stack_ffffffffffffff30);
      local_98._M_cur =
           (__node_type *)
           iVar7._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_90 = iVar7._stride;
      __s = &local_98;
      bVar4 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff28);
      if (!bVar4) break;
      in_stack_ffffffffffffff30 = *(sparse_parameters **)(local_10 + 0xd8);
      in_stack_ffffffffffffff28 =
           (sparse_iterator<float> *)sparse_iterator<float>::index(&local_78,(char *)__s,__c);
      uVar5 = sparse_parameters::stride_shift(local_20);
      fVar1 = *(float *)(&(in_stack_ffffffffffffff30->_map)._M_h._M_buckets +
                        ((ulong)in_stack_ffffffffffffff28 >> ((byte)uVar5 & 0x3f)));
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x27a105);
      fVar2 = pfVar6[2];
      pfVar6 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x27a128);
      local_28 = (double)fVar1 * (double)fVar2 * (double)pfVar6[2] + local_28;
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_ffffffffffffff30);
    }
  }
  return local_28;
}

Assistant:

double regularizer_direction_magnitude(vw& /* all */, bfgs& b, double regularizer, T& weights)
{
  double ret = 0.;
  if (b.regularizers == nullptr)
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += regularizer * (&(*iter))[W_DIR] * (&(*iter))[W_DIR];

  else
  {
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += ((double)b.regularizers[2 * (iter.index() >> weights.stride_shift())]) * (&(*iter))[W_DIR] *
          (&(*iter))[W_DIR];
  }
  return ret;
}